

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  OfType OVar3;
  pointer pcVar4;
  pointer pMVar5;
  size_type sVar6;
  ostream *poVar7;
  char *pcVar8;
  XmlWriter *this_00;
  pointer pMVar9;
  ScopedElement e;
  string elementName;
  ostringstream oss;
  SourceLineInfo local_1f8;
  ScopedElement local_1d0;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  OVar3 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar3 & FailureBit) == Ok) {
    return;
  }
  if (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0) {
    return;
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  pcVar8 = "failure";
  if (OVar3 < Exception) {
    if (1 < (uint)(OVar3 + ~FailureBit)) {
      if ((OVar3 != Unknown) && (OVar3 != FailureBit)) goto LAB_0015c674;
LAB_0015c63c:
      pcVar8 = "internalError";
    }
  }
  else {
    if (OVar3 < DidntThrowException) {
      if (OVar3 == Exception) goto LAB_0015c63c;
      if (OVar3 != ThrewException) goto LAB_0015c674;
    }
    else {
      if (OVar3 == DidntThrowException) goto LAB_0015c666;
      if (OVar3 != FatalErrorCondition) goto LAB_0015c674;
    }
    pcVar8 = "error";
  }
LAB_0015c666:
  std::__cxx11::string::_M_replace((ulong)&local_1c8,0,(char *)0x0,(ulong)pcVar8);
LAB_0015c674:
  this_00 = &this->xml;
  local_1d0.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_1c8);
  paVar1 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"message","");
  paVar2 = &local_1f8.file.field_2;
  pcVar4 = (stats->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
  local_1f8.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar4,
             pcVar4 + (stats->assertionResult).m_resultData.reconstructedExpression._M_string_length
            );
  XmlWriter::writeAttribute(this_00,local_1a8,&local_1f8.file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p);
  }
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"type","");
  pcVar4 = (stats->assertionResult).m_info.macroName._M_dataplus._M_p;
  local_1f8.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar4,
             pcVar4 + (stats->assertionResult).m_info.macroName._M_string_length);
  XmlWriter::writeAttribute(this_00,local_1a8,&local_1f8.file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar4 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_1f8.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar4,
             pcVar4 + (stats->assertionResult).m_resultData.message._M_string_length);
  sVar6 = local_1f8.file._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8.file._M_dataplus._M_p);
  }
  if (sVar6 != 0) {
    pcVar4 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_1f8.file._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar4,
               pcVar4 + (stats->assertionResult).m_resultData.message._M_string_length);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f8.file._M_dataplus._M_p,
                        local_1f8.file._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.file._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f8.file._M_dataplus._M_p);
    }
  }
  pMVar9 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar5 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar9 != pMVar5) {
    do {
      if (pMVar9->type == Info) {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pMVar9->message)._M_dataplus._M_p,
                            (pMVar9->message)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"at ",3);
  paVar1 = &local_1f8.file.field_2;
  pcVar4 = (stats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
  local_1f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar4,
             pcVar4 + (stats->assertionResult).m_info.lineInfo.file._M_string_length);
  local_1f8.line = (stats->assertionResult).m_info.lineInfo.line;
  operator<<((ostream *)local_1a8,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.file._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  XmlWriter::writeText(this_00,&local_1f8.file,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.file._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  XmlWriter::ScopedElement::~ScopedElement(&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

bool AssertionResult::isOk() const {
        return Catch::isOk( m_resultData.resultType ) || shouldSuppressFailure( m_info.resultDisposition );
    }